

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O1

int WebRtcSpl_ScaleAndAddVectorsWithRoundC
              (int16_t *in_vector1,int16_t in_vector1_scale,int16_t *in_vector2,
              int16_t in_vector2_scale,int right_shifts,int16_t *out_vector,size_t length)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = -1;
  if ((((-1 < right_shifts) && (in_vector1 != (int16_t *)0x0)) && (in_vector2 != (int16_t *)0x0)) &&
     ((out_vector != (int16_t *)0x0 && (iVar1 = -1, length != 0)))) {
    iVar1 = 0;
    sVar2 = 0;
    do {
      out_vector[sVar2] =
           (int16_t)((int)in_vector2[sVar2] * (int)in_vector2_scale +
                     (int)in_vector1[sVar2] * (int)in_vector1_scale +
                     ((1 << ((byte)right_shifts & 0x1f)) >> 1) >> ((byte)right_shifts & 0x1f));
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return iVar1;
}

Assistant:

int WebRtcSpl_ScaleAndAddVectorsWithRoundC(const int16_t* in_vector1,
                                           int16_t in_vector1_scale,
                                           const int16_t* in_vector2,
                                           int16_t in_vector2_scale,
                                           int right_shifts,
                                           int16_t* out_vector,
                                           size_t length) {
  size_t i = 0;
  int round_value = (1 << right_shifts) >> 1;

  if (in_vector1 == NULL || in_vector2 == NULL || out_vector == NULL ||
      length == 0 || right_shifts < 0) {
    return -1;
  }

  for (i = 0; i < length; i++) {
    out_vector[i] = (int16_t)((
        in_vector1[i] * in_vector1_scale + in_vector2[i] * in_vector2_scale +
        round_value) >> right_shifts);
  }

  return 0;
}